

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  XmlOutput *pXVar8;
  char *pcVar9;
  undefined4 in_register_00000034;
  XmlOutput *this_00;
  storage_type *psVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  xml_output local_3b8;
  xml_output local_380;
  xml_output local_348;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  this_00 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar11.m_data = (storage_type *)0xd;
  QVar11.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar11);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar5;
  pXVar8 = XmlOutput::operator<<(this_00,&local_70);
  if (*(long *)((long)__buf + 0x70) == 0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar12.m_data = (storage_type *)0x4;
    QVar12.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar12);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_value.d.d = *(Data **)((long)__buf + 0x60);
    local_a8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x68);
    local_a8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x70);
    if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a8);
  if (*(long *)((long)__buf + 0xa0) == 0) {
    local_e0.xo_type = tNothing;
    local_e0.xo_text.d.d = (Data *)0x0;
    local_e0.xo_text.d.ptr = (char16_t *)0x0;
    local_e0.xo_text.d.size = 0;
    local_e0.xo_value.d.d = (Data *)0x0;
    local_e0.xo_value.d.ptr = (char16_t *)0x0;
    local_e0.xo_value.d.size = 0;
  }
  else {
    QVar13.m_data = (storage_type *)0xf;
    QVar13.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar13);
    local_e0.xo_text.d.size = (qsizetype)local_e0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_e0._4_4_,local_e0.xo_type);
    local_e0.xo_type = tAttribute;
    local_e0.xo_text.d.ptr = (char16_t *)local_e0.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0.xo_value.d.d = *(Data **)((long)__buf + 0x90);
    local_e0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x98);
    local_e0.xo_value.d.size = *(qsizetype *)((long)__buf + 0xa0);
    if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_e0.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e0);
  iVar2 = *(int *)((long)__buf + 8);
  if (iVar2 == -1) {
    local_118.xo_type = tNothing;
    local_118.xo_text.d.d = (Data *)0x0;
    local_118.xo_text.d.ptr = (char16_t *)0x0;
    local_118.xo_text.d.size = 0;
    local_118.xo_value.d.d = (Data *)0x0;
    local_118.xo_value.d.ptr = (char16_t *)0x0;
    local_118.xo_value.d.size = 0;
  }
  else {
    QVar14.m_data = (storage_type *)0x20;
    QVar14.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar14);
    local_118.xo_text.d.size = (qsizetype)local_118.xo_text.d.ptr;
    pDVar6 = local_118.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_118._4_4_,local_118.xo_type);
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar15.m_data = psVar10;
    QVar15.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar15);
    local_118.xo_value.d.size = (qsizetype)local_118.xo_text.d.ptr;
    local_118.xo_value.d.d = (Data *)CONCAT44(local_118._4_4_,local_118.xo_type);
    local_118.xo_type = tAttribute;
    local_118.xo_text.d.ptr = (char16_t *)pDVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118.xo_value.d.ptr = (char16_t *)local_118.xo_text.d.d;
    local_118.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_118.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_118.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_118.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_118.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_118.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_118.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_118.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_118);
  iVar2 = *(int *)((long)__buf + 0xc);
  if (iVar2 == -1) {
    local_150.xo_type = tNothing;
    local_150.xo_text.d.d = (Data *)0x0;
    local_150.xo_text.d.ptr = (char16_t *)0x0;
    local_150.xo_text.d.size = 0;
    local_150.xo_value.d.d = (Data *)0x0;
    local_150.xo_value.d.ptr = (char16_t *)0x0;
    local_150.xo_value.d.size = 0;
  }
  else {
    QVar16.m_data = (storage_type *)0x17;
    QVar16.m_size = (qsizetype)&local_150;
    QString::fromUtf8(QVar16);
    local_150.xo_text.d.size = (qsizetype)local_150.xo_text.d.ptr;
    pDVar6 = local_150.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_150._4_4_,local_150.xo_type);
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar17.m_data = psVar10;
    QVar17.m_size = (qsizetype)&local_150;
    QString::fromUtf8(QVar17);
    local_150.xo_value.d.size = (qsizetype)local_150.xo_text.d.ptr;
    local_150.xo_value.d.d = (Data *)CONCAT44(local_150._4_4_,local_150.xo_type);
    local_150.xo_type = tAttribute;
    local_150.xo_text.d.ptr = (char16_t *)pDVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_150.xo_value.d.ptr = (char16_t *)local_150.xo_text.d.d;
    local_150.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_150.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_150.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_150.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_150.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_150.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_150.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_150.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_150);
  iVar2 = *(int *)((long)__buf + 0x10);
  if (iVar2 == 0) {
    local_188.xo_type = tNothing;
    local_188.xo_text.d.d = (Data *)0x0;
    local_188.xo_text.d.ptr = (char16_t *)0x0;
    local_188.xo_text.d.size = 0;
    local_188.xo_value.d.d = (Data *)0x0;
    local_188.xo_value.d.ptr = (char16_t *)0x0;
    local_188.xo_value.d.size = 0;
  }
  else {
    QVar18.m_data = &DAT_0000000c;
    QVar18.m_size = (qsizetype)&local_188;
    QString::fromUtf8(QVar18);
    pcVar7 = local_188.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_188._4_4_,local_188.xo_type);
    QString::number((int)&local_1c0,iVar2);
    local_188.xo_type = tAttribute;
    local_188.xo_text.d.ptr = (char16_t *)local_188.xo_text.d.d;
    local_188.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_188.xo_value.d.d = (Data *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    local_188.xo_value.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
    local_188.xo_value.d.size = (qsizetype)local_1c0.xo_text.d.ptr;
    local_188.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_188.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_188.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_188.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar3 = (int *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_188);
  iVar2 = *(int *)((long)__buf + 0x14);
  QVar19.m_data = (storage_type *)0x11;
  QVar19.m_size = (qsizetype)&local_1c0;
  QString::fromUtf8(QVar19);
  pcVar7 = local_1c0.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
  QString::number((int)&local_1f8,iVar2);
  local_1c0.xo_type = tAttribute;
  local_1c0.xo_text.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
  local_1c0.xo_text.d.size = (qsizetype)pcVar7;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1c0.xo_value.d.d = (Data *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
  local_1c0.xo_value.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
  local_1c0.xo_value.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
  local_1c0.xo_text.d.d = (Data *)pQVar4;
  if ((QArrayData *)local_1c0.xo_value.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    piVar3 = (int *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type),2,0x10);
      }
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_1c0);
  if (*(long *)((long)__buf + 0x28) == 0) {
    local_1f8.xo_type = tNothing;
    local_1f8.xo_text.d.d = (Data *)0x0;
    local_1f8.xo_text.d.ptr = (char16_t *)0x0;
    local_1f8.xo_text.d.size = 0;
    local_1f8.xo_value.d.d = (Data *)0x0;
    local_1f8.xo_value.d.ptr = (char16_t *)0x0;
    local_1f8.xo_value.d.size = 0;
  }
  else {
    QVar20.m_data = (storage_type *)0x17;
    QVar20.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar20);
    local_1f8.xo_text.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    local_1f8.xo_type = tAttribute;
    local_1f8.xo_text.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f8.xo_value.d.d = *(Data **)((long)__buf + 0x18);
    local_1f8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x20);
    local_1f8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x28);
    if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_1f8.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_1f8);
  if (*(long *)((long)__buf + 0x40) == 0) {
    local_230.xo_type = tNothing;
    local_230.xo_text.d.d = (Data *)0x0;
    local_230.xo_text.d.ptr = (char16_t *)0x0;
    local_230.xo_text.d.size = 0;
    local_230.xo_value.d.d = (Data *)0x0;
    local_230.xo_value.d.ptr = (char16_t *)0x0;
    local_230.xo_value.d.size = 0;
  }
  else {
    QVar21.m_data = (storage_type *)0xd;
    QVar21.m_size = (qsizetype)&local_230;
    QString::fromUtf8(QVar21);
    local_230.xo_text.d.size = (qsizetype)local_230.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_230.xo_type = tAttribute;
    local_230.xo_text.d.ptr = (char16_t *)local_230.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_230.xo_value.d.d = *(Data **)((long)__buf + 0x30);
    local_230.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x38);
    local_230.xo_value.d.size = *(qsizetype *)((long)__buf + 0x40);
    if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_230.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_230);
  if (*(long *)((long)__buf + 0x58) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar22.m_data = (storage_type *)0x15;
    QVar22.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar22);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tAttribute;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0x48);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x50);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 0x58);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_268);
  if (*(long *)((long)__buf + 0xb8) == 0) {
    local_2a0.xo_type = tNothing;
    local_2a0.xo_text.d.d = (Data *)0x0;
    local_2a0.xo_text.d.ptr = (char16_t *)0x0;
    local_2a0.xo_text.d.size = 0;
    local_2a0.xo_value.d.d = (Data *)0x0;
    local_2a0.xo_value.d.ptr = (char16_t *)0x0;
    local_2a0.xo_value.d.size = 0;
  }
  else {
    QVar23.m_data = (storage_type *)0xd;
    QVar23.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar23);
    local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    local_2a0.xo_type = tAttribute;
    local_2a0.xo_text.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2a0.xo_value.d.d = *(Data **)((long)__buf + 0xa8);
    local_2a0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xb0);
    local_2a0.xo_value.d.size = *(qsizetype *)((long)__buf + 0xb8);
    if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2a0.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_2a0);
  if (*(long *)((long)__buf + 0xe8) == 0) {
    local_2d8.xo_type = tNothing;
    local_2d8.xo_text.d.d = (Data *)0x0;
    local_2d8.xo_text.d.ptr = (char16_t *)0x0;
    local_2d8.xo_text.d.size = 0;
    local_2d8.xo_value.d.d = (Data *)0x0;
    local_2d8.xo_value.d.ptr = (char16_t *)0x0;
    local_2d8.xo_value.d.size = 0;
  }
  else {
    QVar24.m_data = (storage_type *)0xf;
    QVar24.m_size = (qsizetype)&local_2d8;
    QString::fromUtf8(QVar24);
    local_2d8.xo_text.d.size = (qsizetype)local_2d8.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_2d8._4_4_,local_2d8.xo_type);
    local_2d8.xo_type = tAttribute;
    local_2d8.xo_text.d.ptr = (char16_t *)local_2d8.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2d8.xo_value.d.d = *(Data **)((long)__buf + 0xd8);
    local_2d8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xe0);
    local_2d8.xo_value.d.size = *(qsizetype *)((long)__buf + 0xe8);
    if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2d8.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_2d8);
  iVar2 = *(int *)((long)__buf + 0x108);
  if (iVar2 == -1) {
    local_310.xo_type = tNothing;
    local_310.xo_text.d.d = (Data *)0x0;
    local_310.xo_text.d.ptr = (char16_t *)0x0;
    local_310.xo_text.d.size = 0;
    local_310.xo_value.d.d = (Data *)0x0;
    local_310.xo_value.d.ptr = (char16_t *)0x0;
    local_310.xo_value.d.size = 0;
  }
  else {
    QVar25.m_data = (storage_type *)0xe;
    QVar25.m_size = (qsizetype)&local_310;
    QString::fromUtf8(QVar25);
    local_310.xo_text.d.size = (qsizetype)local_310.xo_text.d.ptr;
    pDVar6 = local_310.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type);
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar26.m_data = psVar10;
    QVar26.m_size = (qsizetype)&local_310;
    QString::fromUtf8(QVar26);
    local_310.xo_value.d.size = (qsizetype)local_310.xo_text.d.ptr;
    local_310.xo_value.d.d = (Data *)CONCAT44(local_310._4_4_,local_310.xo_type);
    local_310.xo_type = tAttribute;
    local_310.xo_text.d.ptr = (char16_t *)pDVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_310.xo_value.d.ptr = (char16_t *)local_310.xo_text.d.d;
    local_310.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_310.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_310.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_310);
  iVar2 = *(int *)((long)__buf + 0x10c);
  if (iVar2 == 0) {
    local_348.xo_type = tNothing;
    local_348.xo_text.d.d = (Data *)0x0;
    local_348.xo_text.d.ptr = (char16_t *)0x0;
    local_348.xo_text.d.size = 0;
    local_348.xo_value.d.d = (Data *)0x0;
    local_348.xo_value.d.ptr = (char16_t *)0x0;
    local_348.xo_value.d.size = 0;
  }
  else {
    QVar27.m_data = &DAT_00000008;
    QVar27.m_size = (qsizetype)&local_348;
    QString::fromUtf8(QVar27);
    pcVar7 = local_348.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type);
    QString::number((int)&local_380,iVar2);
    local_348.xo_type = tAttribute;
    local_348.xo_text.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_348.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_348.xo_value.d.d = (Data *)CONCAT44(local_380._4_4_,local_380.xo_type);
    local_348.xo_value.d.ptr = (char16_t *)local_380.xo_text.d.d;
    local_348.xo_value.d.size = (qsizetype)local_380.xo_text.d.ptr;
    local_348.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_348.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      piVar3 = (int *)CONCAT44(local_380._4_4_,local_380.xo_type);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type),2,0x10);
        }
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_348);
  iVar2 = *(int *)((long)__buf + 0x110);
  QVar28.m_data = &DAT_00000008;
  QVar28.m_size = (qsizetype)&local_380;
  QString::fromUtf8(QVar28);
  pcVar7 = local_380.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type);
  QString::number((int)&local_3b8,iVar2);
  local_380.xo_type = tAttribute;
  local_380.xo_text.d.ptr = (char16_t *)local_380.xo_text.d.d;
  local_380.xo_text.d.size = (qsizetype)pcVar7;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_380.xo_value.d.d = (Data *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
  local_380.xo_value.d.ptr = (char16_t *)local_3b8.xo_text.d.d;
  local_380.xo_value.d.size = (qsizetype)local_3b8.xo_text.d.ptr;
  local_380.xo_text.d.d = (Data *)pQVar4;
  if ((QArrayData *)local_380.xo_value.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_380.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    piVar3 = (int *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type),2,0x10);
      }
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_380);
  iVar2 = *(int *)((long)__buf + 0x114);
  if (iVar2 == -1) {
    local_3b8.xo_type = tNothing;
    local_3b8.xo_text.d.d = (Data *)0x0;
    local_3b8.xo_text.d.ptr = (char16_t *)0x0;
    local_3b8.xo_text.d.size = 0;
    local_3b8.xo_value.d.d = (Data *)0x0;
    local_3b8.xo_value.d.ptr = (char16_t *)0x0;
    local_3b8.xo_value.d.size = 0;
  }
  else {
    QVar29.m_data = (storage_type *)0x18;
    QVar29.m_size = (qsizetype)&local_3b8;
    QString::fromUtf8(QVar29);
    local_3b8.xo_text.d.size = (qsizetype)local_3b8.xo_text.d.ptr;
    pDVar6 = local_3b8.xo_text.d.d;
    pQVar4 = (QArrayData *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar30.m_data = psVar10;
    QVar30.m_size = (qsizetype)&local_3b8;
    QString::fromUtf8(QVar30);
    local_3b8.xo_value.d.size = (qsizetype)local_3b8.xo_text.d.ptr;
    local_3b8.xo_value.d.d = (Data *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
    local_3b8.xo_type = tAttribute;
    local_3b8.xo_text.d.ptr = (char16_t *)pDVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3b8.xo_value.d.ptr = (char16_t *)local_3b8.xo_text.d.d;
    local_3b8.xo_text.d.d = (Data *)pQVar4;
    if ((QArrayData *)local_3b8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QArrayData *)local_3b8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_3b8.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  XmlOutput::operator<<(pXVar8,&local_3b8);
  if (&(local_3b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_380.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_380.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_348.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_348.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  (*this->_vptr_VCProjectWriter[4])(this,this_00,(long)__buf + 0x118);
  if (*(int *)((long)__buf + 0x14) == 4) {
    (*this->_vptr_VCProjectWriter[9])(this,this_00,(long)__buf + 0x868);
  }
  else {
    (*this->_vptr_VCProjectWriter[5])(this,this_00,(long)__buf + 0x438);
  }
  (*this->_vptr_VCProjectWriter[6])(this,this_00,(long)__buf + 0x940);
  (*this->_vptr_VCProjectWriter[7])(this,this_00,(long)__buf + 0x950);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xb78);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xc00);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xcd8);
  (*this->_vptr_VCProjectWriter[10])(this,this_00,(long)__buf + 0xd60);
  (*this->_vptr_VCProjectWriter[0xc])(this,this_00,(long)__buf + 0xc88);
  QVar31.m_data = (storage_type *)0xd;
  QVar31.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar31);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tCloseTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar5;
  XmlOutput::operator<<(this_00,&local_70);
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCConfiguration &tool)
{
    xml << tag(_Configuration)
            << attrS(_Name, tool.Name)
            << attrS(_OutputDirectory, tool.OutputDirectory)
            << attrT(_ATLMinimizesCRunTimeLibraryUsage, tool.ATLMinimizesCRunTimeLibraryUsage)
            << attrT(_BuildBrowserInformation, tool.BuildBrowserInformation)
            << attrE(_CharacterSet, tool.CharacterSet, /*ifNot*/ charSetNotSet)
            << attrE(_ConfigurationType, tool.ConfigurationType)
            << attrS(_DeleteExtensionsOnClean, tool.DeleteExtensionsOnClean)
            << attrS(_ImportLibrary, tool.ImportLibrary)
            << attrS(_IntermediateDirectory, tool.IntermediateDirectory)
            << attrS(_PrimaryOutput, tool.PrimaryOutput)
            << attrS(_ProgramDatabase, tool.ProgramDatabase)
            << attrT(_RegisterOutput, tool.RegisterOutput)
            << attrE(_UseOfATL, tool.UseOfATL, /*ifNot*/ useATLNotSet)
            << attrE(_UseOfMfc, tool.UseOfMfc)
            << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization);
    write(xml, tool.compiler);
    if (tool.ConfigurationType == typeStaticLibrary)
        write(xml, tool.librarian);
    else
        write(xml, tool.linker);
    write(xml, tool.manifestTool);
    write(xml, tool.idl);
    write(xml, tool.postBuild);
    write(xml, tool.preBuild);
    write(xml, tool.preLink);
    write(xml, tool.resource);
    write(xml, tool.deployment);
    xml << closetag(_Configuration);
}